

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_slice(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  SQRESULT SVar3;
  SQObjectValue this;
  long lVar4;
  long lVar5;
  char *err;
  long nidx;
  SQObjectPtr o;
  SQInteger eidx;
  long local_58;
  SQObjectPtr local_50;
  SQObjectPtr t;
  
  o.super_SQObject._type = OT_NULL;
  o.super_SQObject._unVal.pTable = (SQTable *)0x0;
  get_slice_params(v,&local_58,&eidx,&o);
  uVar2 = (o.super_SQObject._unVal.pOuter)->_idx;
  lVar5 = (local_58 >> 0x3f & uVar2) + local_58;
  lVar4 = (eidx >> 0x3f & uVar2) + eidx;
  if (lVar4 < lVar5) {
    err = "wrong indexes";
  }
  else {
    if (lVar4 <= (long)uVar2 && -1 < lVar5) {
      this.pArray = SQArray::Create(v->_sharedstate,lVar4 - lVar5);
      t.super_SQObject._type = OT_NULL;
      t.super_SQObject._unVal.pTable = (SQTable *)0x0;
      for (nidx = 0; lVar4 - lVar5 != nidx; nidx = nidx + 1) {
        SQArray::Get(o.super_SQObject._unVal.pArray,lVar5 + nidx,&t);
        SQArray::Set(this.pArray,nidx,&t);
      }
      local_50.super_SQObject._type = OT_ARRAY;
      pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_50.super_SQObject._unVal.pArray = this.pArray;
      SQVM::Push(v,&local_50);
      SQObjectPtr::~SQObjectPtr(&local_50);
      SQObjectPtr::~SQObjectPtr(&t);
      SVar3 = 1;
      goto LAB_0012a560;
    }
    err = "slice out of range";
  }
  SVar3 = sq_throwerror(v,err);
LAB_0012a560:
  SQObjectPtr::~SQObjectPtr(&o);
  return SVar3;
}

Assistant:

static SQInteger array_slice(HSQUIRRELVM v)
{
    SQInteger sidx,eidx;
    SQObjectPtr o;
    if(get_slice_params(v,sidx,eidx,o)==-1)return -1;
    SQInteger alen = _array(o)->Size();
    if(sidx < 0)sidx = alen + sidx;
    if(eidx < 0)eidx = alen + eidx;
    if(eidx < sidx)return sq_throwerror(v,_SC("wrong indexes"));
    if(eidx > alen || sidx < 0)return sq_throwerror(v, _SC("slice out of range"));
    SQArray *arr=SQArray::Create(_ss(v),eidx-sidx);
    SQObjectPtr t;
    SQInteger count=0;
    for(SQInteger i=sidx;i<eidx;i++){
        _array(o)->Get(i,t);
        arr->Set(count++,t);
    }
    v->Push(arr);
    return 1;

}